

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sections.cpp
# Opt level: O2

void ast::Sections::binary_hex_intel
               (char *file_name,uint word_size,uint byte_order,uint lower_address,
               uint higher_address)

{
  value_type pSVar1;
  byte bVar2;
  uint uVar3;
  reference ppSVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  uint address;
  size_type __n;
  int iVar8;
  int iVar10;
  ofstream file;
  ulong uVar9;
  
  std::ofstream::ofstream(&file,file_name,_S_out);
  for (__n = 0; __n < (ulong)(DAT_0013caa8 - table >> 3); __n = __n + 1) {
    ppSVar4 = std::vector<ast::Section_*,_std::allocator<ast::Section_*>_>::at
                        ((vector<ast::Section_*,_std::allocator<ast::Section_*>_> *)&table,__n);
    pSVar1 = *ppSVar4;
    if ((pSVar1->flags & 1) != 0) {
      uVar5 = pSVar1->base_address;
      if (higher_address < uVar5) break;
      uVar3 = pSVar1->content_size + uVar5;
      if (lower_address < uVar3) {
        if (uVar5 <= lower_address) {
          uVar5 = lower_address;
        }
        if (higher_address <= uVar3) {
          uVar3 = higher_address;
        }
        address = uVar5 + byte_order;
        uVar6 = (ulong)(uVar3 - uVar5) / (ulong)word_size;
        do {
          uVar5 = (uint)uVar6;
          uVar9 = 0x10;
          if (uVar5 < 0x10) {
            uVar9 = uVar6;
          }
          uVar6 = (ulong)address / (ulong)word_size;
          iVar10 = (int)uVar9;
          ostream_printf((ostream *)&file,":%02X%04X00",uVar9,uVar6);
          iVar7 = (int)(uVar6 >> 8) + (int)uVar6 + iVar10;
          while (iVar8 = (int)uVar9, uVar9 = (ulong)(iVar8 - 1), iVar8 != 0) {
            bVar2 = Memory_space::read8((Memory_space *)memory,address);
            ostream_printf((ostream *)&file,"%02X",(ulong)bVar2);
            iVar7 = iVar7 + (uint)bVar2;
            address = address + word_size;
          }
          ostream_printf((ostream *)&file,"%02X\n",(ulong)(-iVar7 & 0xff));
          uVar6 = (ulong)(uVar5 - iVar10);
        } while (0x10 < uVar5);
      }
    }
  }
  ostream_printf((ostream *)&file,":00000001FF\n");
  std::ofstream::close();
  std::ofstream::~ofstream(&file);
  return;
}

Assistant:

void Sections::binary_hex_intel(const char *file_name,
								unsigned word_size, unsigned byte_order,
								unsigned lower_address, unsigned higher_address) {
	try {
		std::ofstream file(file_name);
		for (size_t i = 0; i < table.size(); ++i) {
			Section *section = table.at(i);
			if ((section->flags & Section::LOADABLE) == 0)
				continue;
			if (higher_address < section->base_address)
				break;

			if (lower_address >= section->base_address + section->content_size)
				continue;

			auto section_lower_address = max(lower_address, section->base_address);
			auto section_higher_address = min(higher_address, section->base_address + section->content_size);

			auto address = section_lower_address + byte_order;
			auto size = (section_higher_address - section_lower_address) / word_size;

			do {
				auto rec_len = min(16U, size);
				auto load_address = address / word_size;
				uint8_t cheksum = (rec_len + load_address + (load_address >> 8));
				ostream_printf(file, ":%02X%04X00", rec_len, load_address);
				for (auto j = 0U; j < rec_len; ++j, address += word_size) {
					uint8_t b = memory.read8(address);
					ostream_printf(file, "%02X", b);
					cheksum += b;
				}
				ostream_printf(file, "%02X\n", static_cast<uint8_t >(-cheksum));
				size -= rec_len;
			} while (size > 0);
		}
		ostream_printf(file, ":00000001FF\n");
		file.close();
	} catch (ios_base::failure &e) {
		cerr << e.what();
	}
}